

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

void kex_method_ecdh_cleanup(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  if (key_state->public_key_oct != (uchar *)0x0) {
    (*session->free)(key_state->public_key_oct,&session->abstract);
    key_state->public_key_oct = (uchar *)0x0;
  }
  if ((EVP_PKEY *)key_state->private_key != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)key_state->private_key);
    key_state->private_key = (EVP_PKEY *)0x0;
  }
  if (key_state->data != (uchar *)0x0) {
    (*session->free)(key_state->data,&session->abstract);
    key_state->data = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  if ((key_state->exchange_state).state != libssh2_NB_state_idle) {
    ecdh_exchange_state_cleanup(session,&key_state->exchange_state);
    return;
  }
  return;
}

Assistant:

static void
kex_method_ecdh_cleanup
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    if(key_state->public_key_oct) {
        LIBSSH2_FREE(session, key_state->public_key_oct);
        key_state->public_key_oct = NULL;
    }

    if(key_state->private_key) {
        _libssh2_ecdsa_free(key_state->private_key);
        key_state->private_key = NULL;
    }

    if(key_state->data) {
        LIBSSH2_FREE(session, key_state->data);
        key_state->data = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    if(key_state->exchange_state.state != libssh2_NB_state_idle) {
        ecdh_exchange_state_cleanup(session, &key_state->exchange_state);
    }
}